

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Transcript::Transcript(Transcript *this,string *name,int length)

{
  _Rb_tree_header *p_Var1;
  int stop;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_108;
  Mask local_d0;
  
  Polymer::Polymer(&this->super_Polymer,name,1,length);
  (this->super_Polymer)._vptr_Polymer = (_func_int **)&PTR_Initialize_001a7728;
  p_Var1 = &(this->bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->seq_)._M_dataplus._M_p = (pointer)&(this->seq_).field_2;
  (this->seq_)._M_string_length = 0;
  (this->seq_).field_2._M_local_buf[0] = '\0';
  (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Polymer).attached_ = false;
  stop = (this->super_Polymer).stop_;
  local_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_108._M_impl.super__Rb_tree_header._M_header;
  local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_impl._0_8_ = 0;
  local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108._M_impl.super__Rb_tree_header._M_header._M_right =
       local_108._M_impl.super__Rb_tree_header._M_header._M_left;
  Mask::Mask(&local_d0,stop + 1,stop,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&local_108);
  std::__cxx11::string::_M_assign((string *)&(this->super_Polymer).mask_.super_MobileElement.name_);
  *(ulong *)&(this->super_Polymer).mask_.super_MobileElement.field_0x44 =
       CONCAT44(local_d0.super_MobileElement.speed_._0_4_,local_d0.super_MobileElement._68_4_);
  *(undefined8 *)((long)&(this->super_Polymer).mask_.super_MobileElement.speed_ + 4) =
       local_d0.super_MobileElement._76_8_;
  (this->super_Polymer).mask_.super_MobileElement.start_ = local_d0.super_MobileElement.start_;
  (this->super_Polymer).mask_.super_MobileElement.stop_ = local_d0.super_MobileElement.stop_;
  *(ulong *)&(this->super_Polymer).mask_.super_MobileElement.footprint_ =
       CONCAT44(local_d0.super_MobileElement._68_4_,local_d0.super_MobileElement.footprint_);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_Polymer).mask_.super_MobileElement.gene_bound_);
  (this->super_Polymer).mask_.super_MobileElement.polymerasereadthrough_ =
       local_d0.super_MobileElement.polymerasereadthrough_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::operator=(&(this->super_Polymer).mask_.interactions_._M_t,&local_d0.interactions_._M_t);
  local_d0.super_MobileElement._vptr_MobileElement = (_func_int **)&PTR__Mask_001a74b0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_d0.interactions_._M_t);
  MobileElement::~MobileElement(&local_d0.super_MobileElement);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_108);
  return;
}

Assistant:

Transcript::Transcript(const std::string &name, int length)
    : Polymer(name, 1, length) {
  attached_ = false;
  mask_ = Mask(stop_ + 1, stop_, std::map<std::string, double>());
}